

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O1

bool __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_peers
          (dht_default_storage *this,sha1_hash *info_hash,bool noseed,bool scrape,address *requester
          ,entry *peers)

{
  _Rb_tree_header *p_Var1;
  anon_enum_32 aVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  entry *peVar10;
  pointer pcVar11;
  list_type *this_00;
  string_type *psVar12;
  ulong uVar13;
  _Base_ptr p_Var14;
  long lVar15;
  uint uVar16;
  int iVar17;
  peer_entry *bits;
  long lVar18;
  aux *this_01;
  byte bVar19;
  uint uVar21;
  difference_type __d;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  peer_entry *p;
  _Base_ptr p_Var25;
  long lVar26;
  aux *paVar27;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  size_type __dnew;
  sha1_hash iphash;
  bloom_filter<256> seeds;
  peer_entry requester_entry;
  address local_2d0;
  string_type local_2b0;
  string_type local_290;
  string_type local_270;
  sha1_hash local_24c;
  peer_entry local_238 [6];
  peer_entry local_138 [6];
  address *paVar20;
  
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var25 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var14 = &p_Var1->_M_header;
  paVar20 = requester;
  for (; p_Var25 != (_Base_ptr)0x0; p_Var25 = *(_Base_ptr *)((long)&p_Var25->_M_color + lVar18)) {
    lVar18 = 0x20;
    do {
      uVar24 = *(uint *)((long)&p_Var25->_M_color + lVar18);
      uVar21 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
      uVar8 = *(uint *)((long)(info_hash->m_number)._M_elems + lVar18 + -0x20);
      uVar16 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      bVar19 = (byte)paVar20 & uVar21 <= uVar16 | uVar21 < uVar16;
      paVar20 = (address *)(ulong)bVar19;
      if (uVar24 != uVar8) {
        lVar18 = (ulong)bVar19 * 8 + 0x10;
        if (bVar19 == 0) {
          p_Var14 = p_Var25;
        }
        goto LAB_003b6d56;
      }
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0x34);
    lVar18 = 0x10;
    p_Var14 = p_Var25;
LAB_003b6d56:
    paVar20 = (address *)(ulong)bVar19;
  }
  p_Var25 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var14 != p_Var1) {
    lVar18 = 0x20;
    bVar6 = false;
    do {
      uVar24 = *(uint *)((long)(info_hash->m_number)._M_elems + lVar18 + -0x20);
      uVar16 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
      uVar8 = *(uint *)((long)&p_Var14->_M_color + lVar18);
      uVar21 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      bVar6 = (bool)(bVar6 & uVar16 <= uVar21 | uVar16 < uVar21);
      if (uVar24 != uVar8) {
        if (bVar6) goto LAB_003b6dad;
        break;
      }
      lVar18 = lVar18 + 4;
    } while (lVar18 != 0x34);
    p_Var25 = p_Var14;
  }
LAB_003b6dad:
  if ((_Rb_tree_header *)p_Var25 == p_Var1) {
    sVar3 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    iVar7 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408c);
    bVar6 = iVar7 <= (int)sVar3;
  }
  else {
    lVar18 = 0x50;
    if (requester->type_ == ipv4) {
      lVar18 = 0x38;
    }
    if (*(long *)(p_Var25 + 2) != 0) {
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,p_Var25[1]._M_right,
                 (long)&(p_Var25[1]._M_right)->_M_color + *(long *)(p_Var25 + 2));
      key._M_str = "n";
      key._M_len = 1;
      peVar10 = entry::operator[](peers,key);
      entry::operator=(peVar10,&local_2b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
    }
    if (scrape) {
      memset(local_138,0,0x100);
      memset(local_238,0,0x100);
      lVar26 = *(long *)((long)&p_Var25[1]._M_color + lVar18);
      lVar15 = *(long *)((long)&p_Var25[1]._M_parent + lVar18);
      if (lVar26 != lVar15) {
        do {
          if (*(short *)(lVar26 + 8) == 2) {
            local_2d0._0_8_ = (ulong)*(uint *)(lVar26 + 0xc) << 0x20;
            local_2d0.ipv6_address_.addr_.__in6_u._0_8_ = 0;
            local_2d0.ipv6_address_.addr_.__in6_u._8_8_ = 0;
            local_2d0.ipv6_address_.scope_id_ = 0;
          }
          else {
            local_2d0.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)(lVar26 + 0x10);
            local_2d0.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)(lVar26 + 0x18);
            local_2d0.ipv6_address_.scope_id_ = (unsigned_long)*(uint *)(lVar26 + 0x20);
            local_2d0.type_ = ipv6;
            local_2d0.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
          }
          aux::hash_address(&local_24c,&local_2d0);
          bits = local_138;
          if (*(char *)(lVar26 + 0x24) != '\0') {
            bits = local_238;
          }
          aux::set_bits((uint8_t *)&local_24c,(uint8_t *)bits,0x100);
          lVar26 = lVar26 + 0x28;
        } while (lVar26 != lVar15);
      }
      local_2d0.type_ = 0x100;
      local_2d0.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar11 = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_2d0);
      uVar4 = local_2d0._0_8_;
      local_270.field_2._M_allocated_capacity._0_4_ = local_2d0.type_;
      local_270.field_2._M_allocated_capacity._4_4_ = local_2d0.ipv4_address_.addr_.s_addr;
      local_270._M_dataplus._M_p = pcVar11;
      memcpy(pcVar11,local_138,0x100);
      uVar5 = local_2d0._0_8_;
      local_2d0.type_ = (anon_enum_32)uVar4;
      local_2d0.ipv4_address_.addr_.s_addr = SUB84(uVar4,4);
      local_270._M_string_length._0_4_ = local_2d0.type_;
      local_270._M_string_length._4_4_ = local_2d0.ipv4_address_.addr_.s_addr;
      pcVar11[uVar4] = '\0';
      key_00._M_str = "BFpe";
      key_00._M_len = 4;
      local_2d0._0_8_ = uVar5;
      peVar10 = entry::operator[](peers,key_00);
      entry::operator=(peVar10,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_2d0.type_ = 0x100;
      local_2d0.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      pcVar11 = (pointer)::std::__cxx11::string::_M_create((ulong *)&local_290,(ulong)&local_2d0);
      uVar4 = local_2d0._0_8_;
      local_290.field_2._M_allocated_capacity._0_4_ = local_2d0.type_;
      local_290.field_2._M_allocated_capacity._4_4_ = local_2d0.ipv4_address_.addr_.s_addr;
      local_290._M_dataplus._M_p = pcVar11;
      memcpy(pcVar11,local_238,0x100);
      uVar5 = local_2d0._0_8_;
      local_2d0.type_ = (anon_enum_32)uVar4;
      local_2d0.ipv4_address_.addr_.s_addr = SUB84(uVar4,4);
      local_290._M_string_length._0_4_ = local_2d0.type_;
      local_290._M_string_length._4_4_ = local_2d0.ipv4_address_.addr_.s_addr;
      pcVar11[uVar4] = '\0';
      key_01._M_str = "BFsd";
      key_01._M_len = 4;
      local_2d0._0_8_ = uVar5;
      peVar10 = entry::operator[](peers,key_01);
      entry::operator=(peVar10,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      aVar2 = requester->type_;
      uVar8 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4089);
      uVar24 = uVar8 + 3;
      if (-1 < (int)uVar8) {
        uVar24 = uVar8;
      }
      uVar24 = (int)uVar24 >> 2;
      if (aVar2 == ipv4) {
        uVar24 = uVar8;
      }
      if (*(long *)((long)&p_Var25[1]._M_color + lVar18) ==
          *(long *)((long)&p_Var25[1]._M_parent + lVar18)) {
        uVar24 = uVar8;
      }
      key_02._M_str = "values";
      key_02._M_len = 6;
      peVar10 = entry::operator[](peers,key_02);
      this_00 = entry::list(peVar10);
      this_01 = (aux *)0x0;
      lVar26 = *(long *)((long)&p_Var25[1]._M_color + lVar18);
      for (lVar15 = lVar26; lVar15 != *(long *)((long)&p_Var25[1]._M_parent + lVar18);
          lVar15 = lVar15 + 0x28) {
        uVar13 = (ulong)*(byte *)(lVar15 + 0x24) ^ 1;
        if (!noseed) {
          uVar13 = 1;
        }
        this_01 = this_01 + uVar13;
      }
      uVar13 = (ulong)uVar24;
      if ((int)this_01 <= (int)uVar24) {
        uVar13 = (ulong)this_01 & 0xffffffff;
      }
      if (0 < (int)uVar13) {
        pcVar22 = (char *)(lVar26 + 0x24);
        do {
          if ((noseed) && (*pcVar22 != '\0')) {
            this_01 = (aux *)((ulong)this_01 & 0xffffffff);
          }
          else {
            paVar27 = (aux *)(ulong)((int)this_01 - 1);
            lVar26 = aux::random(this_01);
            this_01 = paVar27;
            if ((uint)lVar26 <= (uint)uVar13) {
              ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                        (this_00);
              psVar12 = entry::string_abi_cxx11_
                                  ((this_00->
                                   super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
              ::std::__cxx11::string::resize((ulong)psVar12,'\x12');
              local_138[0].added.__d.__r = (duration)(psVar12->_M_dataplus)._M_p;
              aux::
              write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&>
                        ((basic_endpoint<boost::asio::ip::tcp> *)(pcVar22 + -0x1c),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_138);
              ::std::__cxx11::string::resize
                        ((ulong)psVar12,
                         (char)local_138[0].added.__d.__r - (char)(psVar12->_M_dataplus)._M_p);
              uVar13 = (ulong)((uint)uVar13 - 1);
            }
          }
          pcVar22 = pcVar22 + 0x28;
        } while (0 < (int)uVar13);
      }
    }
    iVar7 = (int)((ulong)(*(long *)((long)&p_Var25[1]._M_parent + lVar18) -
                         *(long *)((long)&p_Var25[1]._M_color + lVar18)) >> 3);
    iVar17 = iVar7 * -0x33333333;
    iVar9 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408e);
    if (iVar9 == iVar17 || SBORROW4(iVar9,iVar17) != iVar9 + iVar7 * 0x33333333 < 0) {
      local_138[0].added.__d.__r = (duration)0;
      local_138[0].addr.impl_.data_._8_1_ = '\0';
      local_138[0].addr.impl_.data_._9_1_ = '\0';
      local_138[0].addr.impl_.data_._10_1_ = '\0';
      local_138[0].addr.impl_.data_._11_1_ = '\0';
      local_138[0].addr.impl_.data_._12_1_ = '\0';
      local_138[0].addr.impl_.data_._13_1_ = '\0';
      local_138[0].addr.impl_.data_._14_1_ = '\0';
      local_138[0].addr.impl_.data_._15_1_ = '\0';
      local_138[0].addr.impl_.data_._16_8_ = 0;
      local_138[0].addr.impl_.data_.v6.sin6_scope_id = 0;
      local_138[0].addr.impl_.data_._0_8_ = 2;
      local_138[0].seed = false;
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_138[0].addr,requester);
      lVar26 = *(long *)((long)&p_Var25[1]._M_color + lVar18);
      lVar18 = *(long *)((long)&p_Var25[1]._M_parent + lVar18);
      uVar13 = lVar18 - lVar26;
      if (0 < (long)uVar13) {
        uVar13 = (uVar13 >> 3) * -0x3333333333333333;
        do {
          uVar23 = uVar13 >> 1;
          bVar6 = operator<((peer_entry *)(lVar26 + uVar23 * 0x28),local_138);
          if (bVar6) {
            lVar26 = lVar26 + uVar23 * 0x28 + 0x28;
            uVar23 = ~uVar23 + uVar13;
          }
          uVar13 = uVar23;
        } while (0 < (long)uVar23);
      }
      if (lVar26 == lVar18) {
        bVar6 = true;
      }
      else {
        if (*(short *)(lVar26 + 8) == 2) {
          local_238[0].added.__d.__r = (duration)((ulong)*(uint *)(lVar26 + 0xc) << 0x20);
          local_238[0].addr.impl_.data_._0_8_ = 0;
          local_238[0].addr.impl_.data_._8_1_ = '\0';
          local_238[0].addr.impl_.data_._9_1_ = '\0';
          local_238[0].addr.impl_.data_._10_1_ = '\0';
          local_238[0].addr.impl_.data_._11_1_ = '\0';
          local_238[0].addr.impl_.data_._12_1_ = '\0';
          local_238[0].addr.impl_.data_._13_1_ = '\0';
          local_238[0].addr.impl_.data_._14_1_ = '\0';
          local_238[0].addr.impl_.data_._15_1_ = '\0';
          local_238[0].addr.impl_.data_._16_8_ = 0;
        }
        else {
          local_238[0].addr.impl_.data_._0_8_ = *(undefined8 *)(lVar26 + 0x10);
          local_238[0].addr.impl_.data_._8_8_ = *(uchar (*) [8])(lVar26 + 0x18);
          local_238[0].addr.impl_.data_._16_8_ = ZEXT48(*(uint *)(lVar26 + 0x20));
          local_238[0].added.__d.__r = (duration)1;
        }
        bVar6 = boost::asio::ip::operator!=((address *)local_238,requester);
      }
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool get_peers(sha1_hash const& info_hash
			, bool const noseed, bool const scrape, address const& requester
			, entry& peers) const override
		{
			auto const i = m_map.find(info_hash);
			if (i == m_map.end()) return int(m_map.size()) >= m_settings.get_int(settings_pack::dht_max_torrents);

			torrent_entry const& v = i->second;
			auto const& peersv = requester.is_v4() ? v.peers4 : v.peers6;

			if (!v.name.empty()) peers["n"] = v.name;

			if (scrape)
			{
				aux::bloom_filter<256> downloaders;
				aux::bloom_filter<256> seeds;

				for (auto const& p : peersv)
				{
					sha1_hash const iphash = aux::hash_address(p.addr.address());
					if (p.seed) seeds.set(iphash);
					else downloaders.set(iphash);
				}

				peers["BFpe"] = downloaders.to_string();
				peers["BFsd"] = seeds.to_string();
			}
			else
			{
				tcp const protocol = requester.is_v4() ? tcp::v4() : tcp::v6();
				int to_pick = m_settings.get_int(settings_pack::dht_max_peers_reply);
				TORRENT_ASSERT(to_pick >= 0);
				// if these are IPv6 peers their addresses are 4x the size of IPv4
				// so reduce the max peers 4 fold to compensate
				// max_peers_reply should probably be specified in bytes
				if (!peersv.empty() && protocol == tcp::v6())
					to_pick /= 4;
				entry::list_type& pe = peers["values"].list();

				int candidates = int(std::count_if(peersv.begin(), peersv.end()
					, [=](peer_entry const& e) { return !(noseed && e.seed); }));

				to_pick = std::min(to_pick, candidates);

				for (auto iter = peersv.begin(); to_pick > 0; ++iter)
				{
					// if the node asking for peers is a seed, skip seeds from the
					// peer list
					if (noseed && iter->seed) continue;

					TORRENT_ASSERT(candidates >= to_pick);

					// pick this peer with probability
					// <peers left to pick> / <peers left in the set>
					if (aux::random(std::uint32_t(candidates--)) > std::uint32_t(to_pick))
						continue;

					pe.emplace_back();
					std::string& str = pe.back().string();

					str.resize(18);
					std::string::iterator out = str.begin();
					aux::write_endpoint(iter->addr, out);
					str.resize(std::size_t(out - str.begin()));

					--to_pick;
				}
			}

			if (int(peersv.size()) < m_settings.get_int(settings_pack::dht_max_peers))
				return false;

			// we're at the max peers stored for this torrent
			// only send a write token if the requester is already in the set
			// only check for a match on IP because the peer may be announcing
			// a different port than the one it is using to send DHT messages
			peer_entry requester_entry;
			requester_entry.addr.address(requester);
			auto requester_iter = std::lower_bound(peersv.begin(), peersv.end(), requester_entry);
			return requester_iter == peersv.end()
				|| requester_iter->addr.address() != requester;
		}